

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_max_streams(quicly_sentmap_t *map,quicly_sent_packet_t *packet,int acked,
                      quicly_sent_t *sent)

{
  quicly_maxsender_t *m;
  long in_RCX;
  int in_EDX;
  long in_RDI;
  quicly_maxsender_t *maxsender;
  quicly_conn_t *conn;
  
  if (*(int *)(in_RCX + 8) == 0) {
    m = (quicly_maxsender_t *)(in_RDI + -0x98);
  }
  else {
    m = (quicly_maxsender_t *)(in_RDI + -0xb8);
  }
  if (m != (quicly_maxsender_t *)0x0) {
    if (in_EDX == 0) {
      quicly_maxsender_lost(m,(quicly_maxsender_sent_t *)m);
    }
    else {
      quicly_maxsender_acked(m,(quicly_maxsender_sent_t *)m);
    }
    return 0;
  }
  __assert_fail("maxsender != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                ,0xa65,
                "int on_ack_max_streams(quicly_sentmap_t *, const quicly_sent_packet_t *, int, quicly_sent_t *)"
               );
}

Assistant:

static int on_ack_max_streams(quicly_sentmap_t *map, const quicly_sent_packet_t *packet, int acked, quicly_sent_t *sent)
{
    quicly_conn_t *conn = (quicly_conn_t *)((char *)map - offsetof(quicly_conn_t, egress.loss.sentmap));
    quicly_maxsender_t *maxsender = sent->data.max_streams.uni ? &conn->ingress.max_streams.uni : &conn->ingress.max_streams.bidi;
    assert(maxsender != NULL); /* we would only receive an ACK if we have sent the frame */

    if (acked) {
        quicly_maxsender_acked(maxsender, &sent->data.max_streams.args);
    } else {
        quicly_maxsender_lost(maxsender, &sent->data.max_streams.args);
    }

    return 0;
}